

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

void __thiscall TPZVec<std::complex<float>_>::ReallocForNuma(TPZVec<std::complex<float>_> *this)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  complex<float> *__dest;
  long in_RDI;
  complex<float> *newStore;
  complex<float> *local_48;
  
  if ((*(long *)(in_RDI + 0x10) != 0) && (*(long *)(in_RDI + 8) != 0)) {
    uVar1 = *(ulong *)(in_RDI + 0x10);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar1;
    uVar3 = SUB168(auVar2 * ZEXT816(8),0);
    if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    __dest = (complex<float> *)operator_new__(uVar3);
    if (uVar1 != 0) {
      local_48 = __dest;
      do {
        std::complex<float>::complex(local_48,0.0,0.0);
        local_48 = local_48 + 1;
      } while (local_48 != __dest + uVar1);
    }
    memcpy(__dest,*(void **)(in_RDI + 8),*(long *)(in_RDI + 0x10) << 3);
    if (*(void **)(in_RDI + 8) != (void *)0x0) {
      operator_delete__(*(void **)(in_RDI + 8));
    }
    *(complex<float> **)(in_RDI + 8) = __dest;
  }
  return;
}

Assistant:

void ReallocForNuma() {
        if (fNElements == 0 || fStore == NULL)
            return;
        T* newStore = new T[fNElements];
        memcpy((void*)newStore,(void*)fStore,fNElements*sizeof(T));
        delete [] fStore;
        fStore = newStore;
	}